

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIComboBox::setSelected(CGUIComboBox *this,s32 idx)

{
  u32 uVar1;
  wchar_t *pwVar2;
  int in_ESI;
  long in_RDI;
  long *plVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  if ((-2 < in_ESI) &&
     (iVar4 = in_ESI,
     uVar1 = core::array<irr::gui::CGUIComboBox::SComboData>::size
                       ((array<irr::gui::CGUIComboBox::SComboData> *)0x3a2247), iVar4 < (int)uVar1))
  {
    *(int *)(in_RDI + 0x178) = in_ESI;
    if (*(int *)(in_RDI + 0x178) == -1) {
      (**(code **)(**(long **)(in_RDI + 0x140) + 0xa0))(*(long **)(in_RDI + 0x140),L"");
    }
    else {
      plVar3 = *(long **)(in_RDI + 0x140);
      core::array<irr::gui::CGUIComboBox::SComboData>::operator[]
                ((array<irr::gui::CGUIComboBox::SComboData> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffffe0),(u32)((ulong)plVar3 >> 0x20));
      pwVar2 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3a22b6);
      (**(code **)(*plVar3 + 0xa0))(plVar3,pwVar2);
    }
  }
  return;
}

Assistant:

void CGUIComboBox::setSelected(s32 idx)
{
	if (idx < -1 || idx >= (s32)Items.size())
		return;

	Selected = idx;
	if (Selected == -1)
		SelectedText->setText(L"");
	else
		SelectedText->setText(Items[Selected].Name.c_str());
}